

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleTable::child(QAccessibleTable *this,int logicalIndex)

{
  Span *pSVar1;
  int iVar2;
  uint uVar3;
  Role role_;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar4;
  QAccessibleTableCell *this_01;
  QHeaderView *pQVar5;
  QHeaderView *pQVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  const_iterator cVar9;
  uint local_98 [6];
  char *local_80;
  QModelIndex local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  int logicalIndex_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  logicalIndex_local = logicalIndex;
  this_00 = (QAbstractItemView *)view(this);
  if ((this_00 == (QAbstractItemView *)0x0) ||
     (pQVar4 = QAbstractItemView::model(this_00), pQVar4 == (QAbstractItemModel *)0x0)) {
    this_01 = (QAccessibleTableCell *)0x0;
  }
  else {
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::rootIndex((QModelIndex *)&local_58,this_00);
    cVar9 = QHash<int,_unsigned_int>::constFindImpl<int>(&this->childToId,&logicalIndex_local);
    if (cVar9.i.d == (Data<QHashPrivate::Node<int,_unsigned_int>_> *)0x0 && cVar9.i.bucket == 0) {
      pQVar5 = verticalHeader(this);
      pQVar6 = horizontalHeader(this);
      this_01 = (QAccessibleTableCell *)0x0;
      iVar2 = (**(code **)(*(long *)pQVar4 + 0x80))(pQVar4,&local_58);
      iVar2 = iVar2 + (uint)(pQVar5 != (QHeaderView *)0x0);
      uVar3 = logicalIndex_local / iVar2;
      uVar7 = (long)logicalIndex_local % (long)iVar2;
      uVar8 = uVar7 & 0xffffffff;
      iVar2 = (int)uVar7;
      if (pQVar5 != (QHeaderView *)0x0) {
        if (iVar2 == 0) {
          if ((pQVar6 == (QHeaderView *)0x0) || (uVar3 != 0)) {
            this_01 = (QAccessibleTableCell *)operator_new(0x20);
            QAccessibleTableHeaderCell::QAccessibleTableHeaderCell
                      ((QAccessibleTableHeaderCell *)this_01,(QAbstractItemView *)this_00,
                       uVar3 - (pQVar6 != (QHeaderView *)0x0),Vertical);
          }
          else {
            this_01 = (QAccessibleTableCell *)operator_new(0x18);
            QAccessibleTableCornerButton::QAccessibleTableCornerButton
                      ((QAccessibleTableCornerButton *)this_01,(QAbstractItemView *)this_00);
          }
        }
        else {
          this_01 = (QAccessibleTableCell *)0x0;
        }
        uVar8 = (ulong)(iVar2 - 1);
      }
      if (this_01 == (QAccessibleTableCell *)0x0 && pQVar6 != (QHeaderView *)0x0) {
        if (uVar3 == 0) {
          this_01 = (QAccessibleTableCell *)operator_new(0x20);
          QAccessibleTableHeaderCell::QAccessibleTableHeaderCell
                    ((QAccessibleTableHeaderCell *)this_01,(QAbstractItemView *)this_00,(int)uVar8,
                     Horizontal);
        }
        else {
          this_01 = (QAccessibleTableCell *)0x0;
        }
        uVar3 = uVar3 - 1;
      }
      if (this_01 == (QAccessibleTableCell *)0x0) {
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.r = -0x55555556;
        local_78.c = -0x55555556;
        local_78.i._0_4_ = 0xaaaaaaaa;
        local_78.i._4_4_ = 0xaaaaaaaa;
        (**(code **)(*(long *)pQVar4 + 0x60))(&local_78,pQVar4,uVar3,uVar8,&local_58);
        if (((local_78.r < 0) || (local_78.c < 0)) || (local_78.m.ptr == (QAbstractItemModel *)0x0))
        {
          local_98[0] = 2;
          local_98[5] = 0;
          local_98[1] = 0;
          local_98[2] = 0;
          local_98[3] = 0;
          local_98[4] = 0;
          local_80 = "default";
          this_01 = (QAccessibleTableCell *)0x0;
          QMessageLogger::warning
                    ((char *)local_98,"QAccessibleTable::child: Invalid index at: %d %d",
                     (ulong)uVar3,uVar8);
          goto LAB_004db7d9;
        }
        this_01 = (QAccessibleTableCell *)operator_new(0x38);
        role_ = cellRole(this);
        QAccessibleTableCell::QAccessibleTableCell
                  (this_01,(QAbstractItemView *)this_00,&local_78,role_);
      }
      QAccessible::registerAccessibleInterface(&this_01->super_QAccessibleInterface);
      local_98[0] = QAccessible::uniqueId(&this_01->super_QAccessibleInterface);
      QHash<int,unsigned_int>::emplace<unsigned_int_const&>
                ((QHash<int,unsigned_int> *)&this->childToId,&logicalIndex_local,local_98);
    }
    else {
      pSVar1 = (cVar9.i.d)->spans;
      uVar7 = cVar9.i.bucket >> 7;
      this_01 = (QAccessibleTableCell *)
                QAccessible::accessibleInterface
                          (*(uint *)(pSVar1[uVar7].entries
                                     [pSVar1[uVar7].offsets[(uint)cVar9.i.bucket & 0x7f]].storage.
                                     data + 4));
    }
  }
LAB_004db7d9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return &this_01->super_QAccessibleInterface;
}

Assistant:

QAccessibleInterface *QAccessibleTable::child(int logicalIndex) const
{
    QAbstractItemView *theView = view();
    if (!theView)
        return nullptr;

    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return nullptr;

    const QModelIndex rootIndex = theView->rootIndex();
    auto id = childToId.constFind(logicalIndex);
    if (id != childToId.constEnd())
        return QAccessible::accessibleInterface(id.value());

    int vHeader = verticalHeader() ? 1 : 0;
    int hHeader = horizontalHeader() ? 1 : 0;

    int columns = theModel->columnCount(rootIndex) + vHeader;

    int row = logicalIndex / columns;
    int column = logicalIndex % columns;

    QAccessibleInterface *iface = nullptr;

    if (vHeader) {
        if (column == 0) {
            if (hHeader && row == 0) {
                iface = new QAccessibleTableCornerButton(theView);
            } else {
                iface = new QAccessibleTableHeaderCell(theView, row - hHeader, Qt::Vertical);
            }
        }
        --column;
    }
    if (!iface && hHeader) {
        if (row == 0) {
            iface = new QAccessibleTableHeaderCell(theView, column, Qt::Horizontal);
        }
        --row;
    }

    if (!iface) {
        QModelIndex index = theModel->index(row, column, rootIndex);
        if (Q_UNLIKELY(!index.isValid())) {
            qWarning("QAccessibleTable::child: Invalid index at: %d %d", row, column);
            return nullptr;
        }
        iface = new QAccessibleTableCell(theView, index, cellRole());
    }

    QAccessible::registerAccessibleInterface(iface);
    childToId.insert(logicalIndex, QAccessible::uniqueId(iface));
    return iface;
}